

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O2

Renderer * __thiscall rengine::SDLBackend::createRenderer(SDLBackend *this)

{
  OpenGLRenderer *this_00;
  
  if (this->m_surface == (Surface *)0x0) {
    __assert_fail("m_surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xdf,"virtual Renderer *rengine::SDLBackend::createRenderer()");
  }
  if (this->m_gl != (SDL_GLContext)0x0) {
    this_00 = (OpenGLRenderer *)operator_new(0x200);
    OpenGLRenderer::OpenGLRenderer(this_00);
    (this_00->super_Renderer).m_surface = this->m_surface;
    return &this_00->super_Renderer;
  }
  __assert_fail("m_gl",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                ,0xe0,"virtual Renderer *rengine::SDLBackend::createRenderer()");
}

Assistant:

inline Renderer *SDLBackend::createRenderer()
{
    assert(m_surface);
    assert(m_gl);
    OpenGLRenderer *r = new OpenGLRenderer();
    r->setTargetSurface(m_surface);
    return r;
}